

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyImageSingleColoredRow
          (LayeredRenderCase *this,Surface *layer,float rowWidthRatio,Vec4 *barColor,bool logging)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  TestLog *pTVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  ulong __n;
  Surface *pSVar6;
  uint uVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar8;
  int iVar9;
  LogImageSet *this_00;
  int x;
  int iVar10;
  int y;
  Vector<bool,_3> local_418;
  allocator<char> local_415;
  allocator<char> local_414;
  allocator<char> local_413;
  allocator<char> local_412;
  allocator<char> local_411;
  Surface *local_410;
  ulong local_408;
  int local_3fc;
  LayeredRenderCase *local_3f8;
  Vec4 *local_3f0;
  string local_3e8;
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  Surface errorMask;
  RGBA color;
  RGBA refColor;
  string local_330;
  LogImageSet local_310;
  undefined1 local_2d0 [144];
  LogImage local_240;
  undefined1 local_1b0 [8];
  int local_1a8;
  
  __n = CONCAT71(in_register_00000009,logging);
  local_408 = CONCAT44(local_408._4_4_,rowWidthRatio);
  iVar9 = layer->m_width;
  local_410 = layer;
  local_3f0 = barColor;
  tcu::Surface::Surface(&errorMask,iVar9,layer->m_height);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,
                  "Expecting all pixels with distance less or equal to (about) ");
  iVar9 = (int)((float)iVar9 * (float)local_408);
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar9);
  std::operator<<((ostream *)&local_1a8," pixels from left border to be of color ");
  local_2d0._8_4_ = local_3f0->m_data[2];
  local_2d0._0_8_ = *(undefined8 *)local_3f0->m_data;
  tcu::operator<<((ostream *)&local_1a8,(Vector<float,_3> *)local_2d0);
  std::operator<<((ostream *)&local_1a8,".");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
  local_240.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  local_3f8 = this;
  tcu::RGBA::toIVec((RGBA *)local_2d0);
  pSVar6 = local_410;
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)local_2d0);
  local_3fc = iVar9 + -1;
  local_408 = (ulong)(iVar9 + 1);
  bVar2 = true;
  for (iVar9 = 0; iVar9 < pSVar6->m_height; iVar9 = iVar9 + 1) {
    for (iVar10 = 0; iVar10 < pSVar6->m_width; iVar10 = iVar10 + 1) {
      color.m_value =
           *(deUint32 *)
            ((long)(pSVar6->m_pixels).m_ptr + (long)(pSVar6->m_width * iVar9 + iVar10) * 4);
      tcu::RGBA::RGBA(&refColor,local_3f0);
      uVar5 = color.m_value & 0xff;
      uVar7 = color.m_value & 0xff00;
      uVar3 = color.m_value & 0xff0000;
      tcu::RGBA::toIVec((RGBA *)local_1b0);
      local_3a8._0_8_ = local_1b0;
      local_3a8._8_4_ = local_1a8;
      tcu::RGBA::toIVec((RGBA *)local_2d0);
      local_3c8._0_8_ = local_2d0._0_8_;
      local_3c8._8_4_ = local_2d0._8_4_;
      tcu::operator-((tcu *)&local_310,(Vector<int,_3> *)local_3a8,(Vector<int,_3> *)local_3c8);
      tcu::abs<int,3>((tcu *)&local_240,(Vector<int,_3> *)&local_310);
      local_3e8._M_dataplus._M_p = (pointer)0x800000008;
      local_3e8._M_string_length._0_4_ = 8;
      tcu::lessThan<int,3>
                ((tcu *)&local_330,(Vector<int,_3> *)&local_240,(Vector<int,_3> *)&local_3e8);
      local_418.m_data[0] = true;
      local_418.m_data[1] = true;
      local_418.m_data[2] = true;
      bVar1 = tcu::allEqual<bool,3>((Vector<bool,_3> *)&local_330,&local_418);
      bVar8 = ((uVar7 < 0x900 || uVar5 < 9) || uVar3 < 0x90000) ||
              iVar10 < (int)(float)local_408 && bVar1;
      __n = (ulong)bVar8;
      if (local_3fc < iVar10) {
        bVar1 = bVar8;
      }
      if (bVar1 == false) {
        __n = (ulong)(errorMask.m_width * iVar9 + iVar10);
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + __n * 4) = 0xff0000ff;
      }
      bVar2 = (bool)(bVar1 & bVar2);
      pSVar6 = local_410;
    }
  }
  if (bVar2 == false) {
    local_1b0 = (undefined1  [8])
                ((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"Image verification failed. Got unexpected pixels.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3a8,"LayerContent",(allocator<char> *)&local_418);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"Layer content",&local_411);
    tcu::LogImageSet::LogImageSet(&local_310,(string *)local_3a8,(string *)local_3c8);
    iVar9 = (int)pTVar4;
    tcu::LogImageSet::write(&local_310,iVar9,__buf_01,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Layer",&local_412);
    std::__cxx11::string::string<std::allocator<char>>((string *)&color,"Layer",&local_413);
    pSVar6 = local_410;
    tcu::LogImage::LogImage
              ((LogImage *)local_2d0,&local_3e8,(string *)&color,local_410,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2d0,iVar9,__buf_02,(size_t)pSVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&refColor,"ErrorMask",&local_414);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"Errors",&local_415);
    pSVar6 = &errorMask;
    tcu::LogImage::LogImage
              (&local_240,(string *)&refColor,&local_330,pSVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,iVar9,__buf_03,(size_t)pSVar6);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&refColor);
    tcu::LogImage::~LogImage((LogImage *)local_2d0);
    std::__cxx11::string::~string((string *)&color);
    std::__cxx11::string::~string((string *)&local_3e8);
    tcu::LogImageSet::~LogImageSet(&local_310);
    std::__cxx11::string::~string((string *)local_3c8);
    this_00 = (LogImageSet *)local_3a8;
  }
  else {
    local_1b0 = (undefined1  [8])
                ((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"Image is valid.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"LayerContent",(allocator<char> *)&color);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3a8,"Layer content",(allocator<char> *)&refColor);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_310.m_name,(string *)local_3a8);
    tcu::LogImageSet::write((LogImageSet *)&local_240,(int)pTVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"Layer",(allocator<char> *)&local_330);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"Layer",(allocator<char> *)&local_418);
    pSVar6 = local_410;
    tcu::LogImage::LogImage
              ((LogImage *)local_2d0,(string *)local_3c8,&local_3e8,local_410,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2d0,(int)pTVar4,__buf_00,(size_t)pSVar6);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage((LogImage *)local_2d0);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)local_3c8);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
    std::__cxx11::string::~string((string *)local_3a8);
    this_00 = &local_310;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  tcu::Surface::~Surface(&errorMask);
  return bVar2;
}

Assistant:

bool LayeredRenderCase::verifyImageSingleColoredRow (const tcu::Surface& layer, float rowWidthRatio, const tcu::Vec4& barColor, bool logging)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const int		barLength			= (int)(rowWidthRatio * (float)layer.getWidth());
	const int		barLengthThreshold	= 1;
	tcu::Surface	errorMask			(layer.getWidth(), layer.getHeight());
	bool			allPixelsOk			= true;

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting all pixels with distance less or equal to (about) " << barLength << " pixels from left border to be of color " << barColor.swizzle(0,1,2) << "." << tcu::TestLog::EndMessage;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const tcu::RGBA refColor	= tcu::RGBA(barColor);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;
		const bool		isColor		= tcu::allEqual(tcu::lessThan(tcu::abs(color.toIVec().swizzle(0, 1, 2) - refColor.toIVec().swizzle(0, 1, 2)), tcu::IVec3(threshold, threshold, threshold)), tcu::BVec3(true, true, true));

		bool			isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMask.setPixel(x, y, tcu::RGBA::red());
	}

	if (allPixelsOk)
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer", "Layer", layer)
								<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer",		"Layer",	layer)
								<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
								<< tcu::TestLog::EndImageSet;
		return false;
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Image("LayerContent", "Layer content", layer);

	return allPixelsOk;
}